

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.hpp
# Opt level: O2

void __thiscall Executor::Executor(Executor *this,Context *context)

{
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__Executor_001d0928;
  (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
  super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.super__Head_base<0UL,_Value_*,_false>
  ._M_head_impl = (Value *)0x0;
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::deque(&(this->context_).scopes_,&context->scopes_);
  std::
  stack<std::unique_ptr<Value,std::default_delete<Value>>,std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>>
  ::
  stack<std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>,void>
            (&this->returnStack_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdout_);
  this->exitCode_ = 0;
  return;
}

Assistant:

Executor(const Context& context): value_(), context_(context), returnStack_(), stdout_(), exitCode_(0) {}